

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

dictionary_t * __thiscall deci::dictionary_t::operator=(dictionary_t *this,dictionary_t *move)

{
  bool bVar1;
  reference ppVar2;
  pair<deci::value_t_*const,_deci::value_t_*> el;
  iterator __end2;
  iterator __begin2;
  storage_t *__range2;
  dictionary_t *move_local;
  dictionary_t *this_local;
  
  if (this != move) {
    __end2 = std::
             unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
             ::begin(&this->storage);
    el.second = (value_t *)
                std::
                unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
                ::end(&this->storage);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end2.
                          super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                         ,(_Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                           *)&el.second);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
               operator*(&__end2);
      el.first = ppVar2->second;
      (*ppVar2->first->_vptr_value_t[3])();
      (*(el.first)->_vptr_value_t[3])();
      std::__detail::_Node_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
      operator++(&__end2);
    }
    std::
    unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
    ::clear(&this->storage);
    std::
    unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
    ::operator=(&this->storage,&move->storage);
  }
  return this;
}

Assistant:

dictionary_t& dictionary_t::operator = (dictionary_t&& move) {
    if (this != &move) {
      for (auto el: this->storage) {
        el.first->Delete();
        el.second->Delete();
      }
      this->storage.clear();
      this->storage = std::move(move.storage);
    }
    return *this;
  }